

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

ShutdownData * google::protobuf::internal::ShutdownData::get(void)

{
  int iVar1;
  
  if (get()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&get()::data);
    if (iVar1 != 0) {
      get::data = (ShutdownData *)operator_new(0x40);
      (get::data->mutex).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (get::data->mutex).mu_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      *(undefined8 *)((long)&(get::data->mutex).mu_.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(get::data->mutex).mu_.super___mutex_base._M_mutex + 0x10) = 0;
      (get::data->functions).
      super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (get::data->mutex).mu_.super___mutex_base._M_mutex.__align = 0;
      (get::data->functions).
      super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (get::data->functions).
      super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __cxa_guard_release(&get()::data);
    }
  }
  return get::data;
}

Assistant:

static ShutdownData* get() {
    static auto* data = new ShutdownData;
    return data;
  }